

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndMainMenuBar(void)

{
  EndMenuBar();
  if ((GImGui->CurrentWindow == GImGui->NavWindow) && (GImGui->NavLayer == 0)) {
    FocusFrontMostActiveWindow(GImGui->NavWindow);
  }
  End();
  return;
}

Assistant:

void ImGui::EndMainMenuBar()
{
    EndMenuBar();

    // When the user has left the menu layer (typically: closed menus through activation of an item), we restore focus to the previous window
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow == g.NavWindow && g.NavLayer == 0)
        FocusFrontMostActiveWindow(g.NavWindow);

    End();
}